

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,locale_ref loc)

{
  bool bVar1;
  uint uVar2;
  sign sVar3;
  basic_appender<char> bVar4;
  int **ppiVar5;
  undefined8 uVar6;
  bool *pbVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  significand_type significand;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_da [2];
  bool local_d8 [4];
  int local_d4;
  sign local_d0;
  int local_cc;
  basic_appender<char> local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (undefined1  [8])f->significand;
  lVar14 = 0x3f;
  if (((ulong)local_c0 | 1) != 0) {
    for (; ((ulong)local_c0 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
    }
  }
  local_d4 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar14] -
             (uint)((ulong)local_c0 <
                   (ulong)*(basic_specs *)
                           (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar14] * 8));
  uVar8 = (ulong)((local_d4 + 1) - (uint)(s == none));
  local_da[1] = '0';
  local_da[0] = '.';
  local_d0 = s;
  local_c8.container = out.container;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_da[0] = decimal_point_impl<char>(loc);
  }
  uVar6 = auStack_a4._4_8_;
  bVar4.container = local_c8.container;
  uVar13 = f->exponent;
  local_cc = local_d4 + uVar13;
  uVar2 = (specs->super_basic_specs).data_;
  iVar11 = specs->precision;
  bVar9 = (byte)uVar2 & 7;
  if (bVar9 == 1) {
LAB_00216674:
    iVar10 = local_d4 + uVar13 + -1;
    if ((uVar2 >> 0xd & 1) == 0) {
      uVar12 = 0;
      if (local_d4 == 1) {
        local_da[0] = '\0';
      }
    }
    else {
      uVar12 = 0;
      if (0 < iVar11 - local_d4) {
        uVar12 = (ulong)(uint)(iVar11 - local_d4);
      }
      uVar8 = uVar8 + uVar12;
    }
    iVar11 = 1 - local_cc;
    if (0 < local_cc) {
      iVar11 = iVar10;
    }
    lVar14 = 2;
    if (99 < iVar11) {
      lVar14 = (ulong)(999 < iVar11) + 3;
    }
    sVar15 = (3 - (ulong)(local_da[0] == '\0')) + lVar14 + uVar8;
    local_b8._0_4_ = local_d0;
    local_b8._8_8_ = local_c0;
    auStack_a4[0] = local_da[0];
    local_b8._16_4_ = local_d4;
    auStack_a4._4_5_ = CONCAT14('0',(int)uVar12);
    auStack_a4._10_2_ = SUB82(uVar6,6);
    auStack_a4._4_8_ =
         CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar2 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
         0x450000000000;
    auStack_a4._12_4_ = iVar10;
    if (specs->width < 1) {
      uVar8 = sVar15 + (local_c8.container)->size_;
      if ((local_c8.container)->capacity_ < uVar8) {
        (*(local_c8.container)->grow_)(local_c8.container,uVar8);
      }
      bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
              ::anon_class_40_8_fd1bf2f9::operator()
                        ((anon_class_40_8_fd1bf2f9 *)local_b8,bVar4.container);
    }
    else {
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (local_c8,specs,sVar15,sVar15,(anon_class_40_8_fd1bf2f9 *)local_b8);
    }
  }
  else {
    if ((uVar2 & 7) != 2) {
      iVar10 = 0x10;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      if ((local_cc < -3) || (iVar10 < local_cc)) goto LAB_00216674;
    }
    if ((int)uVar13 < 0) {
      if (local_cc < 1) {
        local_70._M_allocated_capacity._0_4_ = -local_cc;
        if ((local_d4 == 0) && (SBORROW4(iVar11,-local_cc) != iVar11 + local_cc < 0 && -1 < iVar11))
        {
          local_70._M_allocated_capacity._0_4_ = iVar11;
        }
        uVar13 = 1;
        if (local_d4 == 0 && local_70._0_4_ == 0) {
          uVar13 = uVar2 >> 0xd & 1;
        }
        local_b8._8_8_ = local_d8;
        local_d8[0] = (bool)(char)uVar13;
        sVar15 = (local_70._0_4_ + uVar13 + 1) + uVar8;
        local_b8._0_8_ = &local_d0;
        unique0x00004e80 = local_da;
        auStack_a4._4_8_ = &local_70;
        auStack_a4._12_8_ = local_da + 1;
        local_90 = (format_specs *)local_c0;
        local_88._M_allocated_capacity = (size_type)&local_d4;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                          (local_c8,specs,sVar15,sVar15,(anon_class_56_7_88befd79 *)local_b8);
        return (basic_appender<char>)bVar4.container;
      }
      uVar16 = 0;
      local_d8 = (bool  [4])(iVar11 - local_d4 & (int)(uVar2 << 0x12) >> 0x1f);
      uVar12 = (ulong)(uint)local_d8;
      if ((int)local_d8 < 1) {
        uVar12 = uVar16;
      }
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
      sVar15 = uVar12 + uVar8;
      pbVar7 = (bool *)local_b8._0_8_;
      do {
        uVar13 = 0x7fffffff;
        if (local_90 != (format_specs *)0x0) {
          if (pbVar7 == (bool *)(local_b8._8_8_ + local_b8._0_8_)) {
            uVar13 = (uint)((bool *)(local_b8._8_8_ + local_b8._0_8_))[-1];
          }
          else {
            bVar1 = *pbVar7;
            if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_002167c1;
            pbVar7 = pbVar7 + 1;
            uVar13 = (uint)bVar1;
          }
          uVar13 = (int)uVar16 + uVar13;
          uVar16 = (ulong)uVar13;
        }
LAB_002167c1:
        sVar15 = sVar15 + 1;
      } while ((int)uVar13 < local_cc);
      local_70._M_allocated_capacity = (size_type)&local_d0;
      local_70._8_8_ = local_c0;
      local_60 = &local_d4;
      local_58 = &local_cc;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_da;
      local_40._M_allocated_capacity = (size_type)local_d8;
      local_40._8_8_ = local_da + 1;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                        (local_c8,specs,sVar15,sVar15,(anon_class_64_8_085c650e *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_a4._12_8_ != &local_88) {
        operator_delete((void *)auStack_a4._12_8_);
      }
      ppiVar5 = (int **)(local_b8 + 0x10);
    }
    else {
      lVar14 = uVar13 + uVar8;
      local_d8 = (bool  [4])(iVar11 - local_cc);
      if ((uVar2 >> 0xd & 1) != 0) {
        if (bVar9 != 2 && (int)local_d8 < 1) {
          local_d8[0] = false;
          local_d8[1] = false;
          local_d8[2] = false;
          local_d8[3] = false;
        }
        lVar14 = lVar14 + 1;
        if (0 < (long)(int)local_d8) {
          lVar14 = lVar14 + (int)local_d8;
        }
      }
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
      sVar15 = lVar14 - 1;
      iVar11 = 0;
      uVar6 = local_70._0_8_;
      do {
        iVar10 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((sign *)uVar6 == (sign *)(local_70._8_8_ + local_70._0_8_)) {
            uVar13 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._0_8_) + -1);
          }
          else {
            sVar3 = *(sign *)uVar6;
            if ((byte)((char)sVar3 + 0x81) < 0x82) goto LAB_002165ed;
            uVar6 = uVar6 + 1;
            uVar13 = (uint)(byte)(char)sVar3;
          }
          iVar11 = iVar11 + uVar13;
          iVar10 = iVar11;
        }
LAB_002165ed:
        sVar15 = sVar15 + 1;
      } while (iVar10 < local_cc);
      local_b8._0_8_ = &local_d0;
      local_b8._8_8_ = local_c0;
      unique0x00004e80 = &local_d4;
      local_88._M_allocated_capacity = (size_type)local_da;
      local_88._8_8_ = local_d8;
      local_78 = local_da + 1;
      auStack_a4._4_8_ = f;
      auStack_a4._12_8_ = &local_70;
      local_90 = specs;
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                        (local_c8,specs,sVar15,sVar15,(anon_class_72_9_eb40e20e *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      ppiVar5 = &local_60;
    }
    if ((int **)ppiVar5[-2] != ppiVar5) {
      operator_delete(ppiVar5[-2]);
    }
  }
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}